

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O0

uint CustomPNGDeflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                     LodePNGCompressSettings *settings)

{
  uchar *in_RCX;
  size_t in_RDX;
  uchar *in_RSI;
  undefined8 in_RDI;
  long in_R8;
  ZopfliOptions *unaff_retaddr;
  uchar **in_stack_00000010;
  undefined8 in_stack_00000018;
  ZopfliOptions options;
  uchar bp;
  ZopfliPNGOptions *png_options;
  ZopfliOptions local_4c;
  undefined1 local_31;
  byte *local_30;
  
  local_30 = *(byte **)(in_R8 + 0x28);
  local_31 = 0;
  ZopfliInitOptions(&local_4c);
  local_4c.verbose = (int)(*local_30 & 1);
  local_4c.numiterations = *(int *)(local_30 + 0x44);
  ZopfliDeflate(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RSI,in_RDX,in_RCX,
                in_stack_00000010,(size_t *)in_stack_00000018);
  return 0;
}

Assistant:

unsigned CustomPNGDeflate(unsigned char** out, size_t* outsize,
                          const unsigned char* in, size_t insize,
                          const LodePNGCompressSettings* settings) {
  const ZopfliPNGOptions* png_options =
      static_cast<const ZopfliPNGOptions*>(settings->custom_context);
  unsigned char bp = 0;
  ZopfliOptions options;
  ZopfliInitOptions(&options);

  options.verbose = png_options->verbose;
  options.numiterations = png_options->num_iterations;

  ZopfliDeflate(&options, 2 /* Dynamic */, 1, in, insize, &bp, out, outsize);

  return 0;  // OK
}